

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void Cnf_ManStop(Cnf_Man_t *p)

{
  Cnf_Man_t *p_local;
  
  Vec_IntFree(p->vMemory);
  if (p->pTruths[0] != (uint *)0x0) {
    free(p->pTruths[0]);
    p->pTruths[0] = (uint *)0x0;
  }
  Aig_MmFlexStop(p->pMemCuts,0);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  if (p->pSops[1] != (char *)0x0) {
    free(p->pSops[1]);
    p->pSops[1] = (char *)0x0;
  }
  if (p->pSops != (char **)0x0) {
    free(p->pSops);
    p->pSops = (char **)0x0;
  }
  if (p != (Cnf_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cnf_ManStop( Cnf_Man_t * p )
{
    Vec_IntFree( p->vMemory );
    ABC_FREE( p->pTruths[0] );
    Aig_MmFlexStop( p->pMemCuts, 0 );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}